

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.cpp
# Opt level: O1

void __thiscall Callback::Emitter::SignalActivation::~SignalActivation(SignalActivation *this)

{
  usize *puVar1;
  State SVar2;
  SignalData *pSVar3;
  SignalActivation *pSVar4;
  Item *pIVar5;
  Item *pIVar6;
  Item *pIVar7;
  Item *item;
  Item *pIVar8;
  Iterator *pIVar9;
  
  if (this->invalidated == false) {
    pSVar3 = this->data;
    if (((pSVar3 != (SignalData *)0x0) &&
        (pSVar4 = this->next, pSVar3->activation = pSVar4, pSVar4 == (SignalActivation *)0x0)) &&
       (pSVar3->dirty == true)) {
      pIVar5 = (pSVar3->slots)._end.item;
      pIVar8 = (pSVar3->slots)._begin.item;
      if (pIVar8 != pIVar5) {
        do {
          SVar2 = (pIVar8->value).state;
          if (SVar2 == connecting) {
            (pIVar8->value).state = connected;
          }
          else if (SVar2 == disconnected) {
            pIVar6 = pIVar8->prev;
            pIVar7 = pIVar8->next;
            pIVar9 = (Iterator *)&pIVar6->next;
            if (pIVar6 == (Item *)0x0) {
              pIVar9 = &(pSVar3->slots)._begin;
            }
            pIVar9->item = pIVar7;
            pIVar7->prev = pIVar6;
            puVar1 = &(pSVar3->slots)._size;
            *puVar1 = *puVar1 - 1;
            pIVar8->prev = (pSVar3->slots).freeItem;
            (pSVar3->slots).freeItem = pIVar8;
          }
          pIVar8 = pIVar8->next;
        } while (pIVar8 != pIVar5);
      }
      pSVar3->dirty = false;
      return;
    }
  }
  else if (this->next != (SignalActivation *)0x0) {
    this->next->invalidated = true;
    return;
  }
  return;
}

Assistant:

Callback::Emitter::SignalActivation::~SignalActivation()
{
  if(!invalidated)
  {
    if(data && !(data->activation = next) && data->dirty)
    {
      for(List<Slot>::Iterator i = data->slots.begin(), end = data->slots.end(); i != end;)
        switch(i->state)
        {
        case Slot::disconnected:
          i = data->slots.remove(i);
          break;
        case Slot::connecting:
          i->state = Slot::connected;
        default:
          ++i;
        }
      data->dirty = false;
    }
  }
  else if(next)
    next->invalidated = true;
}